

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

void Vec_IntDrop(Vec_Int_t *p,int i)

{
  int iVar1;
  int local_18;
  int k;
  int i_local;
  Vec_Int_t *p_local;
  
  if (-1 < i) {
    iVar1 = Vec_IntSize(p);
    if (i < iVar1) {
      p->nSize = p->nSize + -1;
      for (local_18 = i; local_18 < p->nSize; local_18 = local_18 + 1) {
        p->pArray[local_18] = p->pArray[local_18 + 1];
      }
      return;
    }
  }
  __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x40a,"void Vec_IntDrop(Vec_Int_t *, int)");
}

Assistant:

static inline void Vec_IntDrop( Vec_Int_t * p, int i )
{
    int k;
    assert( i >= 0 && i < Vec_IntSize(p) );
    p->nSize--;
    for ( k = i; k < p->nSize; k++ )
        p->pArray[k] = p->pArray[k+1];
}